

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::setBlendMode(GLEngine *this,BlendMode newMode)

{
  GLenum GVar1;
  GLenum GVar2;
  
  switch(newMode) {
  case AlphaOver:
    (*glad_glEnable)(0xbe2);
    GVar1 = 1;
    break;
  case OverNoWrite:
    (*glad_glEnable)(0xbe2);
    GVar2 = 0x303;
    GVar1 = 0;
    goto LAB_0028eb63;
  case AlphaUnder:
    (*glad_glEnable)(0xbe2);
    GVar1 = 0x305;
    goto LAB_0028eb89;
  case Zero:
    (*glad_glEnable)(0xbe2);
    GVar1 = 0;
    goto LAB_0028ebad;
  case WeightedAdd:
    (*glad_glEnable)(0xbe2);
    GVar2 = 1;
    GVar1 = 1;
LAB_0028eb63:
    (*glad_glBlendFuncSeparate)(0x302,GVar2,GVar1,1);
    return;
  case Add:
    (*glad_glEnable)(0xbe2);
    GVar1 = 1;
LAB_0028eb89:
    GVar2 = 1;
    goto LAB_0028ebaf;
  case Source:
    (*glad_glEnable)(0xbe2);
    GVar1 = 0x302;
LAB_0028ebad:
    GVar2 = 0;
    goto LAB_0028ebaf;
  case Disable:
    (*glad_glDisable)(0xbe2);
    GVar1 = 0x302;
    break;
  default:
    return;
  }
  GVar2 = 0x303;
LAB_0028ebaf:
  (*glad_glBlendFunc)(GVar1,GVar2);
  return;
}

Assistant:

void GLEngine::setBlendMode(BlendMode newMode) {
  switch (newMode) {
  case BlendMode::AlphaOver:
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA); // for premultiplied alpha
    break;
  case BlendMode::OverNoWrite:
    glEnable(GL_BLEND);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
    break;
  case BlendMode::AlphaUnder:
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE); // for premultiplied alpha
    break;
  case BlendMode::Zero:
    glEnable(GL_BLEND);
    glBlendFunc(GL_ZERO, GL_ZERO);
    break;
  case BlendMode::WeightedAdd:
    glEnable(GL_BLEND);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE, GL_ONE, GL_ONE);
    break;
  case BlendMode::Add:
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE, GL_ONE);
    break;
  case BlendMode::Source:
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ZERO);
    break;
  case BlendMode::Disable:
    glDisable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA); // doesn't actually matter
    break;
  }
}